

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BigPropertyIndex __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
GetPropertyIndex_EnumerateTTD
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          PropertyRecord *pRecord)

{
  bool bVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  SimpleDictionaryPropertyDescriptor<int> *local_20;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *pRecord_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)pRecord;
  pRecord_local = (PropertyRecord *)this;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&descriptor,&local_20);
  if (!bVar1) {
    TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
  }
  if ((local_20->Attributes & 8) != 0) {
    TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
  }
  return local_20->propertyIndex;
}

Assistant:

Js::BigPropertyIndex SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if(propertyMap->TryGetReference(pRecord, &descriptor))
        {
            TTDAssert(!(descriptor->Attributes & PropertyDeleted), "We found this during enum so what is going on here?");

            return (Js::BigPropertyIndex)descriptor->propertyIndex;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }